

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

_Bool bson_iter_find_case(bson_iter_t *iter,char *key)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *__s2;
  int extraout_EDX;
  char *unaff_RBX;
  _Bool unsupported;
  uint32_t bson_type;
  char *key_1;
  _Bool _Stack_85;
  uint32_t uStack_84;
  char *pcStack_80;
  char *pcStack_78;
  _Bool local_3d;
  uint32_t local_3c;
  char *local_38;
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_find_case_cold_2();
  }
  else {
    unaff_RBX = key;
    if (key != (char *)0x0) {
      do {
        _Var1 = _bson_iter_next_internal(iter,&local_38,&local_3c,&local_3d);
        if (!_Var1) {
          return _Var1;
        }
        iVar2 = bson_strcasecmp(key,(char *)(iter->raw + iter->key));
      } while (iVar2 != 0);
      return _Var1;
    }
  }
  bson_iter_find_case_cold_1();
  if (extraout_EDX != 0) {
    iVar2 = extraout_EDX;
    pcStack_78 = unaff_RBX;
    if (extraout_EDX < 0) {
      sVar4 = strlen(key);
      iVar2 = (int)sVar4;
    }
    _Var1 = _bson_iter_next_internal(iter,&pcStack_80,&uStack_84,&_Stack_85);
    if (_Var1) {
      do {
        __s2 = bson_iter_key(iter);
        iVar3 = strncmp(key,__s2,(long)iVar2);
        if ((iVar3 == 0) && (__s2[iVar2] == '\0')) {
          return true;
        }
        _Var1 = _bson_iter_next_internal(iter,&pcStack_80,&uStack_84,&_Stack_85);
      } while (_Var1);
    }
    return false;
  }
  return false;
}

Assistant:

bool
bson_iter_find_case (bson_iter_t *iter, /* INOUT */
                     const char *key)   /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (key);

   while (bson_iter_next (iter)) {
      if (!bson_strcasecmp (key, bson_iter_key (iter))) {
         return true;
      }
   }

   return false;
}